

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void __thiscall
cfd::core::JsonObjectVector<cfd::api::json::PsbtSignatureData,_PsbtSignatureDataStruct>::
ConvertFromStruct(JsonObjectVector<cfd::api::json::PsbtSignatureData,_PsbtSignatureDataStruct> *this
                 ,vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_> *list)

{
  bool bVar1;
  PsbtSignatureData *in_RDI;
  PsbtSignatureData object;
  PsbtSignatureDataStruct *element;
  const_iterator __end0;
  const_iterator __begin0;
  vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_> *__range3;
  PsbtSignatureDataStruct *in_stack_ffffffffffffff38;
  value_type *in_stack_ffffffffffffff48;
  vector<cfd::api::json::PsbtSignatureData,_std::allocator<cfd::api::json::PsbtSignatureData>_>
  *in_stack_ffffffffffffff50;
  PsbtSignatureData *in_stack_ffffffffffffff80;
  __normal_iterator<const_PsbtSignatureDataStruct_*,_std::vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (PsbtSignatureDataStruct *)
       ::std::vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>::begin
                 (in_stack_ffffffffffffff38);
  ::std::vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>::end
            ((vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_> *)
             in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_PsbtSignatureDataStruct_*,_std::vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_PsbtSignatureDataStruct_*,_std::vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>_>
                        *)in_stack_ffffffffffffff38);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_PsbtSignatureDataStruct_*,_std::vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>_>
    ::operator*(local_20);
    in_stack_ffffffffffffff38 = (PsbtSignatureDataStruct *)&stack0xffffffffffffff58;
    cfd::api::json::PsbtSignatureData::PsbtSignatureData(in_stack_ffffffffffffff80);
    cfd::api::json::PsbtSignatureData::ConvertFromStruct(in_RDI,in_stack_ffffffffffffff38);
    ::std::
    vector<cfd::api::json::PsbtSignatureData,_std::allocator<cfd::api::json::PsbtSignatureData>_>::
    push_back(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    cfd::api::json::PsbtSignatureData::~PsbtSignatureData(in_RDI);
    __gnu_cxx::
    __normal_iterator<const_PsbtSignatureDataStruct_*,_std::vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>_>
    ::operator++(local_20);
  }
  return;
}

Assistant:

void ConvertFromStruct(const std::vector<STRUCT_TYPE>& list) {
    for (const auto& element : list) {
      TYPE object;
      object.ConvertFromStruct(element);
      std::vector<TYPE>::push_back(object);
    }
  }